

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O2

OptionStatus
checkOptionValue(HighsLogOptions *report_log_options,OptionRecordInt *option,HighsInt value)

{
  char *format;
  pointer pcVar1;
  
  if (value < option->lower_bound) {
    pcVar1 = (option->super_OptionRecord).name._M_dataplus._M_p;
    format = "checkOptionValue: Value %d for option \"%s\" is below lower bound of %d\n";
  }
  else {
    if (value <= option->upper_bound) {
      return kOk;
    }
    pcVar1 = (option->super_OptionRecord).name._M_dataplus._M_p;
    format = "checkOptionValue: Value %d for option \"%s\" is above upper bound of %d\n";
  }
  highsLogUser(report_log_options,kWarning,format,value,pcVar1);
  return kIllegalValue;
}

Assistant:

OptionStatus checkOptionValue(const HighsLogOptions& report_log_options,
                              OptionRecordInt& option, const HighsInt value) {
  if (value < option.lower_bound) {
    highsLogUser(report_log_options, HighsLogType::kWarning,
                 "checkOptionValue: Value %" HIGHSINT_FORMAT
                 " for option \"%s\" is below "
                 "lower bound of %" HIGHSINT_FORMAT "\n",
                 value, option.name.c_str(), option.lower_bound);
    return OptionStatus::kIllegalValue;
  } else if (value > option.upper_bound) {
    highsLogUser(report_log_options, HighsLogType::kWarning,
                 "checkOptionValue: Value %" HIGHSINT_FORMAT
                 " for option \"%s\" is above "
                 "upper bound of %" HIGHSINT_FORMAT "\n",
                 value, option.name.c_str(), option.upper_bound);
    return OptionStatus::kIllegalValue;
  }
  return OptionStatus::kOk;
}